

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Graph.cpp
# Opt level: O1

void __thiscall Graph::removeVertex(Graph *this,int idx)

{
  Node **__src;
  pointer *pppNVar1;
  pointer ppNVar2;
  Node *pNVar3;
  _Base_ptr p_Var4;
  Node **ppNVar5;
  __normal_iterator<Node_**,_std::vector<Node_*,_std::allocator<Node_*>_>_> __dest;
  Node *pNVar6;
  ostream *poVar7;
  _Base_ptr p_Var8;
  iterator __position;
  Node **node;
  pointer ppNVar9;
  vector<Node_*,_std::allocator<Node_*>_> *__range1;
  char local_39;
  Node *local_38;
  
  ppNVar9 = (this->adj_list).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppNVar2 = (this->adj_list).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  local_38 = getNode(this,idx);
  __dest = std::
           __find_if<__gnu_cxx::__normal_iterator<Node**,std::vector<Node*,std::allocator<Node*>>>,__gnu_cxx::__ops::_Iter_equals_val<Node*const>>
                     (ppNVar9,ppNVar2);
  ppNVar2 = (this->adj_list).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppNVar9 = (this->adj_list).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppNVar9 != ppNVar2; ppNVar9 = ppNVar9 + 1) {
    pNVar3 = *ppNVar9;
    pNVar6 = getNode(this,idx);
    __position._M_node = &(pNVar3->edges)._M_t._M_impl.super__Rb_tree_header._M_header;
    p_Var8 = __position._M_node;
    for (p_Var4 = (pNVar3->edges)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[*(Node **)(p_Var4 + 1) < pNVar6]) {
      if (*(Node **)(p_Var4 + 1) >= pNVar6) {
        p_Var8 = p_Var4;
      }
    }
    if ((p_Var8 != __position._M_node) && (*(Node **)(p_Var8 + 1) <= pNVar6)) {
      __position._M_node = p_Var8;
    }
    if ((_Rb_tree_header *)__position._M_node !=
        &((*ppNVar9)->edges)._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<Node*,std::pair<Node*const,int>,std::_Select1st<std::pair<Node*const,int>>,std::less<Node*>,std::allocator<std::pair<Node*const,int>>>
      ::erase_abi_cxx11_((_Rb_tree<Node*,std::pair<Node*const,int>,std::_Select1st<std::pair<Node*const,int>>,std::less<Node*>,std::allocator<std::pair<Node*const,int>>>
                          *)&(*ppNVar9)->edges,__position);
    }
  }
  __src = __dest._M_current + 1;
  ppNVar5 = (this->adj_list).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if (__src != ppNVar5) {
    memmove(__dest._M_current,__src,(long)ppNVar5 - (long)__src);
  }
  pppNVar1 = &(this->adj_list).super__Vector_base<Node_*,_std::allocator<Node_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  *pppNVar1 = *pppNVar1 + -1;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Removed Vertex ",0xf);
  poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,idx);
  local_39 = '\n';
  std::__ostream_insert<char,std::char_traits<char>>(poVar7,&local_39,1);
  return;
}

Assistant:

void Graph::removeVertex(int idx) {
    auto it = std::find(adj_list.begin(), adj_list.end(), getNode(idx));

    for(auto&node:adj_list){
        auto iter = node->edges.find(getNode(idx));
        if(iter!=node->edges.end())
            node->edges.erase(iter);
    }

    adj_list.erase(it);

    std::cerr<< "Removed Vertex " << idx<<'\n';
}